

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O3

bool __thiscall FileSystemUtils::Path::CreateDir(Path *this)

{
  int iVar1;
  Path parentpath;
  stat buffer;
  Path local_c8;
  stat local_a0;
  
  if (((this->m_string)._M_string_length == 0) ||
     (iVar1 = stat((this->m_string)._M_dataplus._M_p,&local_a0), iVar1 == 0)) {
    return false;
  }
  ParentPath(&local_c8,this);
  iVar1 = stat(local_c8.m_string._M_dataplus._M_p,&local_a0);
  if (iVar1 != 0) {
    CreateDir(&local_c8);
  }
  iVar1 = mkdir((this->m_string)._M_dataplus._M_p,0x1ff);
  local_c8._vptr_Path = (_func_int **)&PTR__Path_0011b9a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p == &local_c8.m_string.field_2) {
    return iVar1 == 0;
  }
  operator_delete(local_c8.m_string._M_dataplus._M_p,
                  local_c8.m_string.field_2._M_allocated_capacity + 1);
  return iVar1 == 0;
}

Assistant:

inline bool Path::CreateDir() const
	{
        if( m_string.length() == 0 )
        {
            return false;
        }
        if( Exists() )
        {
            return false;
        }

        // we may need to create the parent path recursively
        Path parentpath = ParentPath();
        if( !parentpath.Exists() )
        {
            parentpath.CreateDir();
        }

		int error = -1;
#ifdef _WIN32
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		error = _wmkdir( temp.c_str() );
#else
		error = mkdir( m_string.c_str(), 0777 );
#endif
		if( 0 == error )
		{
			return true;
		}
		return false;
	}